

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_typed_timesamples<std::vector<long,std::allocator<long>>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedTimeSamples<std::vector<long,_std::allocator<long>_>_> *v,uint32_t indent)

{
  pointer pSVar1;
  vector<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample>_>
  *pvVar2;
  long lVar3;
  ostream *poVar4;
  uint32_t n;
  long lVar5;
  size_t i;
  ulong uVar6;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::operator<<(local_1a8,"{\n");
  pvVar2 = TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::get_samples
                     ((TypedTimeSamples<std::vector<long,_std::allocator<long>_>_> *)this);
  lVar5 = 0x20;
  uVar6 = 0;
  while( true ) {
    lVar3 = (long)(pvVar2->
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar2->
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    n = (uint32_t)(lVar3 % 0x28);
    if ((ulong)(lVar3 / 0x28) <= uVar6) break;
    pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)((int)v + 1),n);
    std::operator<<(local_1a8,(string *)&local_1d8);
    poVar4 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)(pvVar2->
                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x20));
    std::operator<<(poVar4,": ");
    std::__cxx11::string::_M_dispose();
    pSVar1 = (pvVar2->
             super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*(char *)((long)&pSVar1->t + lVar5) == '\x01') {
      std::operator<<(local_1a8,"None");
    }
    else {
      std::operator<<(local_1a8,
                      (vector<long,_std::allocator<long>_> *)((long)pSVar1 + lVar5 + -0x18));
    }
    std::operator<<(local_1a8,",\n");
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x28;
  }
  pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)v & 0xffffffff),n);
  poVar4 = std::operator<<(local_1a8,(string *)&local_1d8);
  std::operator<<(poVar4,"}\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_timesamples(const TypedTimeSamples<T> &v,
                                    const uint32_t indent = 0) {
  std::stringstream ss;

  ss << "{\n";

  const auto &samples = v.get_samples();

  for (size_t i = 0; i < samples.size(); i++) {
    ss << pprint::Indent(indent + 1) << samples[i].t << ": ";
    if (samples[i].blocked) {
      ss << "None";
    } else {
      ss << samples[i].value;
    }
    ss << ",\n";
  }

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}